

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

CTcDataStream * CTcDataStream::get_stream_from_id(char stream_id,textchar_t *obj_fname)

{
  undefined8 in_RSI;
  undefined1 in_DIL;
  CTcCodeStream *local_8;
  
  switch(in_DIL) {
  case 1:
    local_8 = (CTcCodeStream *)G_ds;
    break;
  case 2:
    local_8 = G_cs_main;
    break;
  case 3:
    local_8 = (CTcCodeStream *)G_os;
    break;
  default:
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2e21,in_RSI);
    local_8 = (CTcCodeStream *)0x0;
    break;
  case 6:
    local_8 = (CTcCodeStream *)G_bignum_stream;
    break;
  case 8:
    local_8 = (CTcCodeStream *)G_icmod_stream;
    break;
  case 9:
    local_8 = G_cs_static;
    break;
  case 10:
    local_8 = (CTcCodeStream *)G_static_init_id_stream;
    break;
  case 0xb:
    local_8 = (CTcCodeStream *)G_lcl_stream;
    break;
  case 0xc:
    local_8 = (CTcCodeStream *)G_rexpat_stream;
  }
  return &local_8->super_CTcDataStream;
}

Assistant:

CTcDataStream *CTcDataStream::
   get_stream_from_id(char stream_id, const textchar_t *obj_fname)
{
    switch(stream_id)
    {
    case TCGEN_DATA_STREAM:
        return G_ds;

    case TCGEN_CODE_STREAM:
        return G_cs_main;

    case TCGEN_STATIC_CODE_STREAM:
        return G_cs_static;

    case TCGEN_OBJECT_STREAM:
        return G_os;

    case TCGEN_ICMOD_STREAM:
        return G_icmod_stream;

    case TCGEN_BIGNUM_STREAM:
        return G_bignum_stream;

    case TCGEN_REXPAT_STREAM:
        return G_rexpat_stream;

    case TCGEN_STATIC_INIT_ID_STREAM:
        return G_static_init_id_stream;

    case TCGEN_LCL_VAR_STREAM:
        return G_lcl_stream;

    default:
        G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                            TCERR_OBJFILE_INVAL_STREAM_ID, obj_fname);
        return 0;
    }
}